

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddTwiceListedError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FileDescriptorProto *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 in_RDI;
  int index_00;
  string *in_stack_00000050;
  ErrorLocation in_stack_0000005c;
  Message *in_stack_00000060;
  string *in_stack_00000068;
  undefined4 in_stack_00000070;
  FileDescriptorProto *in_stack_ffffffffffffff80;
  string local_58 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  index_00 = (int)((ulong)in_RDI >> 0x20);
  this_00 = (FileDescriptorProto *)
            FileDescriptorProto::dependency_abi_cxx11_(in_stack_ffffffffffffff80,index_00);
  FileDescriptorProto::dependency_abi_cxx11_(this_00,index_00);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+(in_RSI,(char *)this_00);
  AddError((DescriptorBuilder *)CONCAT44(index,in_stack_00000070),in_stack_00000068,
           in_stack_00000060,in_stack_0000005c,in_stack_00000050);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void DescriptorBuilder::AddTwiceListedError(const FileDescriptorProto& proto,
                                            int index) {
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT,
           "Import \"" + proto.dependency(index) + "\" was listed twice.");
}